

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_int64 UnixFile_Write(void *pUserData,void *pBuffer,jx9_int64 nWrite)

{
  bool bVar1;
  ssize_t sVar2;
  jx9_int64 jVar3;
  size_t sVar4;
  char *zData;
  jx9_int64 jVar5;
  
  if (nWrite < 1) {
    return 0;
  }
  jVar5 = 0;
  do {
    sVar2 = write((int)pUserData,pBuffer,nWrite);
    sVar4 = nWrite;
    if (sVar2 < 1) break;
    jVar5 = jVar5 + sVar2;
    pBuffer = (void *)((long)pBuffer + sVar2);
    sVar4 = nWrite - sVar2;
    bVar1 = sVar2 <= nWrite;
    nWrite = sVar4;
  } while (sVar4 != 0 && bVar1);
  jVar3 = -1;
  if ((long)sVar4 < 1) {
    jVar3 = jVar5;
  }
  return jVar3;
}

Assistant:

static jx9_int64 UnixFile_Write(void *pUserData, const void *pBuffer, jx9_int64 nWrite)
{
	const char *zData = (const char *)pBuffer;
	int fd = SX_PTR_TO_INT(pUserData);
	jx9_int64 nCount;
	ssize_t nWr;
	nCount = 0;
	for(;;){
		if( nWrite < 1 ){
			break;
		}
		nWr = write(fd, zData, (size_t)nWrite);
		if( nWr < 1 ){
			/* IO error */
			break;
		}
		nWrite -= nWr;
		nCount += nWr;
		zData += nWr;
	}
	if( nWrite > 0 ){
		return -1;
	}
	return nCount;
}